

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::absolute(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  path *ppVar3;
  int iVar4;
  error_category *peVar5;
  int *piVar6;
  ulong uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  path *result_2;
  char cVar9;
  char *pcVar10;
  ulong uVar11;
  path result_1;
  path base;
  path result;
  path local_108;
  path local_e8;
  path local_c8;
  path local_a8;
  path local_88;
  path local_68;
  path local_48;
  
  peVar5 = (error_category *)std::_V2::system_category();
  ec->_M_value = 0;
  ec->_M_cat = peVar5;
  current_path(&local_e8,ec);
  if (ec->_M_value != 0) {
    piVar6 = __errno_location();
    ec->_M_value = *piVar6;
    ec->_M_cat = peVar5;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    goto LAB_0011dc9a;
  }
  uVar7 = (p->_path)._M_string_length;
  if (uVar7 == 0) {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_e8._path._M_dataplus._M_p,
               local_e8._path._M_dataplus._M_p + local_e8._path._M_string_length);
    path::operator/=(__return_storage_ptr__,p);
    goto LAB_0011dc9a;
  }
  if (uVar7 < 3) {
    uVar7 = 0;
LAB_0011ddc0:
    if ((p->_path)._M_dataplus._M_p[uVar7] == '/') {
LAB_0011de44:
      path::root_name(&local_108,&local_e8);
      (__return_storage_ptr__->_path)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->_path).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_108._path._M_dataplus._M_p,
                 local_108._path._M_dataplus._M_p + local_108._path._M_string_length);
      path::operator/=(__return_storage_ptr__,p);
      ppVar3 = &local_108;
LAB_0011de7c:
      paVar8 = &(ppVar3->_path).field_2;
      puVar2 = *(undefined1 **)(paVar8->_M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2 != paVar8) {
        operator_delete(puVar2);
      }
      goto LAB_0011dc9a;
    }
  }
  else {
    pcVar10 = (p->_path)._M_dataplus._M_p;
    cVar9 = (char)p;
    if ((((*pcVar10 == '/') && (pcVar10[1] == '/')) && (pcVar10[2] != 0x2f)) &&
       (iVar4 = isprint((int)pcVar10[2]), iVar4 != 0)) {
      uVar7 = std::__cxx11::string::find(cVar9,0x2f);
      uVar11 = (p->_path)._M_string_length;
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar11;
      }
      if (uVar7 != 0) {
        if (uVar11 < 3) {
          uVar7 = 0;
LAB_0011de95:
          if ((uVar7 < uVar11) && (pcVar10 = (p->_path)._M_dataplus._M_p, pcVar10[uVar7] == '/')) {
LAB_0011dea4:
            (__return_storage_ptr__->_path)._M_dataplus._M_p =
                 (pointer)&(__return_storage_ptr__->_path).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,pcVar10,pcVar10 + uVar11);
            goto LAB_0011dc9a;
          }
        }
        else {
          pcVar10 = (p->_path)._M_dataplus._M_p;
          if (*pcVar10 == '/') {
            if (((pcVar10[1] == '/') && (pcVar10[2] != 0x2f)) &&
               (iVar4 = isprint((int)pcVar10[2]), iVar4 != 0)) {
              uVar7 = std::__cxx11::string::find(cVar9,0x2f);
              uVar11 = (p->_path)._M_string_length;
              if (uVar7 == 0xffffffffffffffff) {
                uVar7 = uVar11;
              }
              goto LAB_0011de95;
            }
            goto LAB_0011dea4;
          }
        }
        path::root_name(&local_a8,p);
        path::root_directory(&local_48,&local_e8);
        paVar8 = &local_c8._path.field_2;
        local_c8._path._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_a8._path._M_dataplus._M_p,
                   local_a8._path._M_dataplus._M_p + local_a8._path._M_string_length);
        path::operator/=(&local_c8,&local_48);
        path::relative_path(&local_68,&local_e8);
        paVar1 = &local_108._path.field_2;
        local_108._path._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,local_c8._path._M_dataplus._M_p,
                   local_c8._path._M_dataplus._M_p + local_c8._path._M_string_length);
        path::operator/=(&local_108,&local_68);
        path::relative_path(&local_88,p);
        (__return_storage_ptr__->_path)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_path).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,local_108._path._M_dataplus._M_p,
                   local_108._path._M_dataplus._M_p + local_108._path._M_string_length);
        path::operator/=(__return_storage_ptr__,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._path._M_dataplus._M_p != &local_88._path.field_2) {
          operator_delete(local_88._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._path._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._path._M_dataplus._M_p != &local_68._path.field_2) {
          operator_delete(local_68._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._path._M_dataplus._M_p != paVar8) {
          operator_delete(local_c8._path._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._path._M_dataplus._M_p != &local_48._path.field_2) {
          operator_delete(local_48._path._M_dataplus._M_p);
        }
        ppVar3 = &local_a8;
        goto LAB_0011de7c;
      }
      if (2 < uVar11) goto LAB_0011ddd5;
      uVar7 = 0;
LAB_0011de13:
      if (uVar7 < uVar11) goto LAB_0011ddc0;
    }
    else {
LAB_0011ddd5:
      pcVar10 = (p->_path)._M_dataplus._M_p;
      if (*pcVar10 == '/') {
        if (((pcVar10[1] == '/') && (pcVar10[2] != 0x2f)) &&
           (iVar4 = isprint((int)pcVar10[2]), iVar4 != 0)) {
          uVar7 = std::__cxx11::string::find(cVar9,0x2f);
          uVar11 = (p->_path)._M_string_length;
          if (uVar7 == 0xffffffffffffffff) {
            uVar7 = uVar11;
          }
          goto LAB_0011de13;
        }
        goto LAB_0011de44;
      }
    }
  }
  (__return_storage_ptr__->_path)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_path).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_e8._path._M_dataplus._M_p,
             local_e8._path._M_dataplus._M_p + local_e8._path._M_string_length);
  path::operator/=(__return_storage_ptr__,p);
LAB_0011dc9a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._path._M_dataplus._M_p != &local_e8._path.field_2) {
    operator_delete(local_e8._path._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(GHC_NATIVEWP(p), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(GHC_NATIVEWP(p), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}